

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compressionTables.cpp
# Opt level: O0

uint16_t handleQuantizeCloseExp
                   (uint16_t abssrc,uint16_t tolSig,float errTol,float srcFloat,int doprint)

{
  ushort uVar1;
  int iVar2;
  int in_EDX;
  ushort in_SI;
  ushort in_DI;
  float in_XMM0_Da;
  float fVar3;
  float in_XMM1_Da;
  float smalldelta;
  float delta;
  int smallbits;
  int bits;
  uint16_t smallest;
  uint16_t alt;
  float alt0delta;
  float alt1delta;
  uint16_t alternates [3];
  uint16_t mask3;
  uint16_t extrabit;
  uint16_t srcMaskedVal;
  uint16_t mask2;
  uint16_t mask;
  uint16_t lowermask;
  uint16_t npow2;
  float local_40;
  int local_38;
  ushort local_30;
  ushort local_24;
  ushort local_22;
  
  uVar1 = (ushort)((in_DI & 0x3ff) < in_SI);
  local_22 = (uVar1 << 0xb | (ushort)((uVar1 != 0 ^ 0xffU) & 1) << 9) ^ 0xf800;
  if (in_EDX != 0) {
    printf("  === npow == 0x0400\n");
    printf("  mask2  0x%04X %016b\n",0xf800);
    printf("  mask3  0x%04X %016b\n",(ulong)local_22,(ulong)local_22);
    printf("  extra  %d\n",(ulong)uVar1);
  }
  if ((in_DI & 0x400) == 0) {
    if (in_EDX != 0) {
      printf("   -- absrc & npow2 == 0\n");
    }
    if (uVar1 == 0) {
      local_24 = in_DI & 0xfc00;
      local_22 = in_DI & local_22;
    }
    else {
      local_24 = in_DI & local_22;
      local_22 = in_DI & 0xfc00;
    }
  }
  else if (uVar1 == 0) {
    local_24 = in_DI & 0xf800;
    local_22 = in_DI & local_22;
    fVar3 = imath_half_to_float(local_24);
    if (in_XMM1_Da - fVar3 < in_XMM0_Da) {
      if (in_EDX != 0) {
        printf("  ebit1  0x%04X ok\n",(ulong)local_22);
      }
    }
    else {
      if (in_EDX != 0) {
        printf("  swap1  0x%04X <-> 0x%04X mask\n",(ulong)local_24,(ulong)(in_DI & 0xfc00));
      }
      local_24 = in_DI & 0xfc00;
    }
  }
  else {
    local_24 = in_DI & local_22;
    local_22 = in_DI & 0xf800;
    fVar3 = imath_half_to_float(local_22);
    if (in_XMM1_Da - fVar3 < in_XMM0_Da) {
      if (in_EDX != 0) {
        printf("  ebit1  0x%04X ok\n",(ulong)local_22);
      }
    }
    else {
      if (in_EDX != 0) {
        printf("  swap1  0x%04X <-> 0x%04X mask\n",(ulong)local_22,(ulong)(in_DI & 0xfc00));
      }
      local_22 = in_DI & 0xfc00;
    }
  }
  uVar1 = in_DI + 0x400 & 0xfc00;
  if (in_EDX != 0) {
    printf("  sortp  0x%04X 0x%04X 0x%04X\n",(ulong)local_24,(ulong)local_22,(ulong)uVar1);
    printf("  test0  0x%04X %016b\n",(ulong)local_24,(ulong)local_24);
    printf("  test1  0x%04X %016b\n",(ulong)local_22,(ulong)local_22);
    printf("  test2  0x%04X %016b\n",(ulong)uVar1,(ulong)uVar1);
  }
  local_38 = countSetBits(in_DI);
  iVar2 = countSetBits(local_24);
  local_30 = in_DI;
  if (iVar2 < local_38) {
    fVar3 = imath_half_to_float(local_24);
    fVar3 = in_XMM1_Da - fVar3;
    local_40 = in_XMM0_Da;
    if (fVar3 < in_XMM0_Da) {
      if (in_EDX != 0) {
        printf("  smltst 0x%04X delta %g\n",(double)fVar3,(ulong)local_24);
      }
      local_30 = local_24;
      local_40 = fVar3;
      local_38 = iVar2;
    }
  }
  else {
    local_40 = in_XMM0_Da;
    if (iVar2 == local_38) {
      fVar3 = imath_half_to_float(local_24);
      local_40 = in_XMM0_Da;
      if (in_XMM1_Da - fVar3 < in_XMM0_Da) {
        local_30 = local_24;
        local_40 = in_XMM1_Da - fVar3;
        local_38 = iVar2;
      }
    }
  }
  iVar2 = countSetBits(local_22);
  if (iVar2 < local_38) {
    fVar3 = imath_half_to_float(local_22);
    fVar3 = in_XMM1_Da - fVar3;
    if (fVar3 < in_XMM0_Da) {
      if (in_EDX != 0) {
        printf("  smltst 0x%04X delta %g\n",(double)fVar3,(ulong)local_22);
      }
      local_30 = local_22;
      local_40 = fVar3;
      local_38 = iVar2;
    }
  }
  else if (iVar2 == local_38) {
    fVar3 = imath_half_to_float(local_22);
    if (in_XMM1_Da - fVar3 < local_40) {
      local_30 = local_22;
      local_40 = in_XMM1_Da - fVar3;
      local_38 = iVar2;
    }
  }
  iVar2 = countSetBits(uVar1);
  if (iVar2 < local_38) {
    fVar3 = imath_half_to_float(uVar1);
    if ((fVar3 - in_XMM1_Da < in_XMM0_Da) && (local_30 = uVar1, in_EDX != 0)) {
      printf("  lrgtst 0x%04X delta %g\n",(double)(fVar3 - in_XMM1_Da),(ulong)uVar1);
    }
  }
  else if ((iVar2 == local_38) &&
          (fVar3 = imath_half_to_float(uVar1), fVar3 - in_XMM1_Da < local_40)) {
    local_30 = uVar1;
  }
  return local_30;
}

Assistant:

static uint16_t handleQuantizeCloseExp (
    uint16_t abssrc, uint16_t tolSig, float errTol, float srcFloat, int doprint)
{
    const uint16_t npow2 = 0x0400;
    const uint16_t lowermask = npow2 - 1;
    const uint16_t mask = ~lowermask;
    const uint16_t mask2 = mask ^ npow2;

    const uint16_t srcMaskedVal = abssrc & lowermask;
    const uint16_t extrabit = (tolSig > srcMaskedVal);

    const uint16_t mask3 = mask2 ^ (((npow2 << 1) * (extrabit)) |
                                    ((npow2 >> 1) * (!extrabit)));

    if (doprint)
    {
        printf ("  === npow == 0x0400\n");
        printf ("  mask2  0x%04X %016b\n", mask2, mask2);
        printf ("  mask3  0x%04X %016b\n", mask3, mask3);
        printf ("  extra  %d\n", extrabit);
    }

    uint16_t alternates[3];

    if ((abssrc & npow2) == 0) // by definition, src&mask2 == src&mask
    {
        if (doprint)
        {
            printf ("   -- absrc & npow2 == 0\n");
        }
        if (extrabit)
        {
            alternates[0] = (abssrc & mask3);
            alternates[1] = (abssrc & mask);
        }
        else
        {
            alternates[0] = (abssrc & mask);
            alternates[1] = (abssrc & mask3);
        }
    }
    else
    {
        if (extrabit)
        {
            alternates[0] = (abssrc & mask3);
            alternates[1] = (abssrc & mask2);
            float alt1delta = srcFloat - imath_half_to_float(alternates[1]);
            if (alt1delta >= errTol)
            {
                if (doprint)
                {
                    printf ("  swap1  0x%04X <-> 0x%04X mask\n", alternates[1], (abssrc & mask));
                }
                alternates[1] = (abssrc & mask);
            }
            else if (doprint)
            {
                printf ("  ebit1  0x%04X ok\n", alternates[1]);
            }
        }
        else
        {
            alternates[0] = (abssrc & mask2);
            alternates[1] = (abssrc & mask3);
            float alt0delta = srcFloat - imath_half_to_float(alternates[0]);
            if (alt0delta >= errTol)
            {
                if (doprint)
                {
                    printf ("  swap1  0x%04X <-> 0x%04X mask\n", alternates[0], (abssrc & mask));
                }
                alternates[0] = (abssrc & mask);
            }
            else if (doprint)
            {
                printf ("  ebit1  0x%04X ok\n", alternates[1]);
            }
        }
    }
    alternates[2] = ((abssrc + npow2) & mask);

    if (doprint)
    {
        printf ("  sortp  0x%04X 0x%04X 0x%04X\n",
                alternates[0], alternates[1], alternates[2]);
        printf ("  test0  0x%04X %016b\n", alternates[0], alternates[0]);
        printf ("  test1  0x%04X %016b\n", alternates[1], alternates[1]);
        printf ("  test2  0x%04X %016b\n", alternates[2], alternates[2]);
    }
    uint16_t alt, smallest = abssrc;
    int bits, smallbits = countSetBits(abssrc);
    float delta, smalldelta = errTol;

    TEST_QUANT_ALTERNATE_SMALL(alternates[0]);
    TEST_QUANT_ALTERNATE_SMALL(alternates[1]);
    TEST_QUANT_ALTERNATE_LARGE(alternates[2]);

    return smallest;
}